

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::allocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,size_t size,char *file,
          size_t line,bool allocatNodesSeperately)

{
  char *memory_00;
  MemoryLeakDetectorNode *node_00;
  MemoryLeakDetectorNode *node;
  char *memory;
  bool allocatNodesSeperately_local;
  size_t line_local;
  char *file_local;
  size_t size_local;
  TestMemoryAllocator *allocator_local;
  MemoryLeakDetector *this_local;
  
  memory_00 = allocateMemoryWithAccountingInformation
                        (this,allocator,size,file,line,allocatNodesSeperately);
  if (memory_00 == (char *)0x0) {
    this_local = (MemoryLeakDetector *)0x0;
  }
  else {
    node_00 = createMemoryLeakAccountingInformation
                        (this,allocator,size,memory_00,allocatNodesSeperately);
    storeLeakInformation(this,node_00,memory_00,size,allocator,file,line);
    this_local = *(MemoryLeakDetector **)(node_00 + 0x10);
  }
  return (char *)this_local;
}

Assistant:

char* MemoryLeakDetector::allocMemory(TestMemoryAllocator* allocator, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    /* With malloc, it is harder to guarantee that the allocator free is called.
     * This is because operator new is overloaded via linker symbols, but malloc just via #defines.
     * If the same allocation is used and the wrong free is called, it will deallocate the memory leak information
     * without the memory leak detector ever noticing it!
     * So, for malloc, we'll allocate the memory separately so we can detect this and give a proper error.
     */

    char* memory = allocateMemoryWithAccountingInformation(allocator, size, file, line, allocatNodesSeperately);
    if (memory == NULLPTR) return NULLPTR;
    MemoryLeakDetectorNode* node = createMemoryLeakAccountingInformation(allocator, size, memory, allocatNodesSeperately);

    storeLeakInformation(node, memory, size, allocator, file, line);
    return node->memory_;
}